

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDV.cpp
# Opt level: O1

void __thiscall
Storage::MassStorage::HDV::set_block
          (HDV *this,size_t address,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  long lVar1;
  size_t __n;
  void *__buf;
  ulong offset;
  
  offset = 0xffffffffffffffff;
  if ((0x3f < (long)address) &&
     (lVar1 = (address - 0x40) * 0x200, lVar1 <= this->image_size_ + -0x200)) {
    offset = this->file_start_ + lVar1;
  }
  __n = address - 0x40 | offset;
  if (-1 < (long)__n) {
    FileHolder::seek(&this->file_,offset,0);
    FileHolder::write(&this->file_,(int)data,__buf,__n);
    return;
  }
  return;
}

Assistant:

void HDV::set_block(size_t address, const std::vector<uint8_t> &data) {
	const auto source_address = mapper_.to_source_address(address);
	const auto file_offset = offset_for_block(source_address);

	if(source_address >= 0 && file_offset >= 0) {
		file_.seek(file_offset, SEEK_SET);
		file_.write(data);
	}
}